

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtom.cpp
# Opt level: O0

void __thiscall OpenMD::DirectionalAtom::DirectionalAtom(DirectionalAtom *this,AtomType *dAtomType)

{
  bool bVar1;
  double *pdVar2;
  AtomType *in_RSI;
  long *in_RDI;
  int i;
  Mat3x3d inertiaTensor;
  int nLinearAxis;
  MultipoleAdapter ma;
  DirectionalAdapter da;
  SquareMatrix3<double> *in_stack_fffffffffffffe98;
  SquareMatrix3<double> *in_stack_fffffffffffffea0;
  errorStruct *peVar3;
  AtomType *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  uint i_00;
  undefined1 local_128 [48];
  MultipoleAdapter *in_stack_ffffffffffffff08;
  MultipoleAdapter *in_stack_ffffffffffffff18;
  int local_dc;
  MultipoleAdapter local_78 [10];
  DirectionalAdapter local_28 [3];
  AtomType *local_10;
  
  local_10 = in_RSI;
  Atom::Atom((Atom *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8);
  *in_RDI = (long)&PTR__DirectionalAtom_004fe470;
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x268461);
  Vector3<double>::Vector3((Vector3<double> *)0x268474);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x26848c);
  *(undefined4 *)(in_RDI + 1) = 1;
  DirectionalAdapter::DirectionalAdapter(local_28,local_10);
  DirectionalAdapter::getI((DirectionalAdapter *)in_stack_ffffffffffffff08);
  SquareMatrix3<double>::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2684f0);
  MultipoleAdapter::MultipoleAdapter(local_78,local_10);
  bVar1 = MultipoleAdapter::isDipole(in_stack_ffffffffffffff08);
  if (bVar1) {
    MultipoleAdapter::getDipole(in_stack_ffffffffffffff18);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffea0,
               (Vector3<double> *)in_stack_fffffffffffffe98);
  }
  bVar1 = MultipoleAdapter::isQuadrupole(in_stack_ffffffffffffff08);
  if (bVar1) {
    MultipoleAdapter::getQuadrupole(in_stack_ffffffffffffff18);
    SquareMatrix3<double>::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x268628);
  }
  local_dc = 0;
  (**(code **)(*in_RDI + 0x28))(local_128);
  for (i_00 = 0; (int)i_00 < 3; i_00 = i_00 + 1) {
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)local_128,i_00,i_00);
    if (ABS(*pdVar2) < 1e-06) {
      *(undefined1 *)(in_RDI + 4) = 1;
      *(uint *)((long)in_RDI + 0x24) = i_00;
      local_dc = local_dc + 1;
    }
  }
  if (1 < local_dc) {
    peVar3 = &painCave;
    snprintf(painCave.errMsg,2000,
             "Directional Atom warning.\n\tOpenMD found more than one axis in this directional atom with a vanishing \n\tmoment of inertia."
            );
    peVar3->isFatal = 0;
    simError();
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x26875c);
  return;
}

Assistant:

DirectionalAtom::DirectionalAtom(AtomType* dAtomType) : Atom(dAtomType) {
    objType_ = otDAtom;

    DirectionalAdapter da = DirectionalAdapter(dAtomType);
    I_                    = da.getI();

    MultipoleAdapter ma = MultipoleAdapter(dAtomType);
    if (ma.isDipole()) { dipole_ = ma.getDipole(); }
    if (ma.isQuadrupole()) { quadrupole_ = ma.getQuadrupole(); }

    // Check if one of the diagonal inertia tensor of this directional
    // atom is zero:
    int nLinearAxis       = 0;
    Mat3x3d inertiaTensor = getI();
    for (int i = 0; i < 3; i++) {
      if (fabs(inertiaTensor(i, i)) < OpenMD::epsilon) {
        linear_     = true;
        linearAxis_ = i;
        ++nLinearAxis;
      }
    }

    if (nLinearAxis > 1) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Directional Atom warning.\n"
          "\tOpenMD found more than one axis in this directional atom with a "
          "vanishing \n"
          "\tmoment of inertia.");
      painCave.isFatal = 0;
      simError();
    }
  }